

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O0

void psocks_connection_establish(void *vctx)

{
  SockAddr *pSVar1;
  char *pcVar2;
  _STACK *p_Var3;
  char *msg;
  char *err;
  psocks_connection *conn;
  void *vctx_local;
  
  pSVar1 = sk_namelookup(*(char **)((long)vctx + 0x10),(char **)((long)vctx + 0x18),0);
  *(SockAddr **)((long)vctx + 0x28) = pSVar1;
  pcVar2 = sk_addr_error(*(SockAddr **)((long)vctx + 0x28));
  if (pcVar2 == (char *)0x0) {
    *(undefined1 *)((long)vctx + 0x38) = 1;
    p_Var3 = sk_new(*(cmp **)((long)vctx + 0x28));
    *(_STACK **)((long)vctx + 0x30) = p_Var3;
  }
  else {
    pcVar2 = dupprintf("name lookup failed: %s",pcVar2);
    chan_open_failed(*(Channel **)((long)vctx + 8),pcVar2);
    safefree(pcVar2);
    psocks_conn_free((psocks_connection *)vctx);
  }
  return;
}

Assistant:

static void psocks_connection_establish(void *vctx)
{
    psocks_connection *conn = (psocks_connection *)vctx;

    /*
     * Look up destination host name.
     */
    conn->addr = sk_namelookup(conn->host, &conn->realhost, ADDRTYPE_UNSPEC);

    const char *err = sk_addr_error(conn->addr);
    if (err) {
        char *msg = dupprintf("name lookup failed: %s", err);
        chan_open_failed(conn->chan, msg);
        sfree(msg);

        psocks_conn_free(conn);
        return;
    }

    /*
     * Make the connection.
     */
    conn->connecting = true;
    conn->socket = sk_new(conn->addr, conn->port, false, false, false, false,
                          &conn->plug);
}